

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFileEqnStorage.cpp
# Opt level: O2

void __thiscall
TPZFileEqnStorage<std::complex<float>_>::Forward
          (TPZFileEqnStorage<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *f,
          DecomposeType dec)

{
  long __off;
  int iVar1;
  ostream *poVar2;
  size_t sVar3;
  int64_t __off_00;
  int64_t i;
  long lVar4;
  int64_t position;
  TPZFMatrix<std::complex<float>_> *local_32c8;
  TPZEqnArray<std::complex<float>_> REqnArray;
  
  local_32c8 = f;
  TPZEqnArray<std::complex<float>_>::TPZEqnArray(&REqnArray);
  for (lVar4 = 0;
      lVar4 < (this->fBlockPos).super_TPZManVector<long,_10>.super_TPZVec<long>.fNElements;
      lVar4 = lVar4 + 1) {
    __off = (this->fBlockPos).super_TPZManVector<long,_10>.super_TPZVec<long>.fStore[lVar4];
    if (__off != 0) {
      iVar1 = fseek((FILE *)this->fIOStream,__off,0);
      if (iVar1 != 0) {
        poVar2 = std::operator<<((ostream *)&std::cout,"fseek fail on Element ");
        poVar2 = std::ostream::_M_insert<long>((long)poVar2);
        poVar2 = std::operator<<(poVar2," Position ");
        poVar2 = std::ostream::_M_insert<long>((long)poVar2);
        std::endl<char,std::char_traits<char>>(poVar2);
        std::ostream::flush();
      }
      sVar3 = fread(&position,8,1,(FILE *)this->fIOStream);
      __off_00 = position;
      if (sVar3 == 0) {
        poVar2 = std::operator<<((ostream *)&std::cout,"fread fail on Element ");
        poVar2 = std::ostream::_M_insert<long>((long)poVar2);
        poVar2 = std::operator<<(poVar2," Position ");
        __off_00 = position;
        poVar2 = std::ostream::_M_insert<long>((long)poVar2);
        std::endl<char,std::char_traits<char>>(poVar2);
        poVar2 = std::operator<<((ostream *)&std::cout,"EOF ");
        iVar1 = feof((FILE *)this->fIOStream);
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
        std::endl<char,std::char_traits<char>>(poVar2);
        poVar2 = std::operator<<((ostream *)&std::cout,"Error Number ");
        iVar1 = ferror((FILE *)this->fIOStream);
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
        std::endl<char,std::char_traits<char>>(poVar2);
        std::ostream::flush();
      }
      iVar1 = fseek((FILE *)this->fIOStream,__off_00,0);
      if (iVar1 != 0) {
        poVar2 = std::operator<<((ostream *)&std::cout,"fseek fail on Element ");
        poVar2 = std::ostream::_M_insert<long>((long)poVar2);
        poVar2 = std::operator<<(poVar2," Position ");
        poVar2 = std::ostream::_M_insert<long>((long)poVar2);
        std::endl<char,std::char_traits<char>>(poVar2);
        std::ostream::flush();
      }
      TPZEqnArray<std::complex<float>_>::Read(&REqnArray,this->fIOStream);
      TPZEqnArray<std::complex<float>_>::EqnForward(&REqnArray,local_32c8,dec);
    }
  }
  TPZEqnArray<std::complex<float>_>::~TPZEqnArray(&REqnArray);
  return;
}

Assistant:

void TPZFileEqnStorage<TVar>::Forward(TPZFMatrix<TVar> &f, DecomposeType dec) const
{
	TPZEqnArray<TVar> REqnArray;
	for(int64_t i=0;i<fBlockPos.NElements();i++) {
		if (fBlockPos[i]) {
			if(fseek(fIOStream,fBlockPos[i],SEEK_SET)){
				cout << "fseek fail on Element " << i << " Position " << fBlockPos[i] << endl;
				cout.flush();
			}
			int64_t position;
			if(!fread(&position,sizeof(int64_t),1,fIOStream)){
				cout << "fread fail on Element " << i << " Position " << position << endl;
				cout << "EOF " << feof(fIOStream) << endl;
				cout << "Error Number " << ferror(fIOStream) << endl;
				cout.flush();
			}
			if(fseek(fIOStream,position,SEEK_SET)){
				cout << "fseek fail on Element " << i << " Position " << position << endl;
				cout.flush();
			}
			
			REqnArray.Read(fIOStream);
			REqnArray.EqnForward(f,dec);
		}
	}
}